

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int lj_cf_jit_prngstate(lua_State *L)

{
  ulong uVar1;
  uint64_t uVar2;
  double dVar3;
  MSize MVar4;
  GCtab *t;
  TValue *pTVar5;
  GCtab *t_00;
  undefined4 extraout_var;
  cTValue *pcVar6;
  int32_t key;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  PRNGState prng;
  ulong local_58 [4];
  undefined8 local_38;
  
  t = lj_tab_new(L,8,0);
  uVar2 = (L->glref).ptr64;
  lVar8 = 0x10;
  uVar7 = 0;
  do {
    if (uVar7 + 1 < (ulong)t->asize) {
      pTVar5 = (TValue *)((t->array).ptr64 + lVar8 + -8);
    }
    else {
      pTVar5 = lj_tab_setinth(L,t,(int)uVar7 + 1);
    }
    uVar1 = uVar7 + 2;
    pTVar5->n = (double)*(int *)((long)(uVar2 + 0xf08) + uVar7 * 4);
    if (uVar1 < t->asize) {
      pTVar5 = (TValue *)((t->array).ptr64 + lVar8);
    }
    else {
      pTVar5 = lj_tab_setinth(L,t,(int)uVar7 + 2);
    }
    pTVar5->n = (double)*(int *)(uVar2 + 0xf0c + uVar7 * 4);
    lVar8 = lVar8 + 0x10;
    uVar7 = uVar1;
  } while (uVar1 != 8);
  pTVar5 = L->top;
  if ((pTVar5 <= L->base) || (dVar3 = L->base->n, dVar3 == -NAN)) goto LAB_0015bfe4;
  if ((uint)((ulong)dVar3 >> 0x2f) < 0x1fff3) {
    if ((dVar3 != (double)((long)dVar3 & 0xffffffff)) ||
       (NAN(dVar3) || NAN((double)((long)dVar3 & 0xffffffff)))) {
LAB_0015c010:
      lj_err_arg(L,1,LJ_ERR_PRNGSTATE);
    }
    local_58[0] = (ulong)(int)dVar3;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
  }
  else {
    uVar9 = 0;
    t_00 = lj_lib_checktab(L,1);
    MVar4 = lj_tab_len(t_00);
    if (8 < (int)MVar4) goto LAB_0015c010;
    if (0 < (int)MVar4) {
      local_38 = CONCAT44(extraout_var,MVar4);
      uVar9 = MVar4 + 1;
      uVar7 = 1;
      do {
        key = (int32_t)uVar7;
        if (uVar7 < t_00->asize) {
          pcVar6 = (cTValue *)(uVar7 * 8 + (t_00->array).ptr64);
        }
        else {
          pcVar6 = lj_tab_getinth(t_00,key);
        }
        dVar3 = pcVar6->n;
        if (((0xfff8 < (ushort)((ulong)dVar3 >> 0x30)) ||
            (dVar3 != (double)((long)dVar3 & 0xffffffff))) ||
           (NAN(dVar3) || NAN((double)((long)dVar3 & 0xffffffff)))) goto LAB_0015c010;
        if ((uVar7 & 1) == 0) {
          local_58[key - 1U >> 1] = local_58[key - 1U >> 1] | (ulong)(uint)(int)dVar3 << 0x20;
        }
        else {
          local_58[key - 1U >> 1] = (long)(int)dVar3;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar9);
      if (6 < (uint)local_38) goto LAB_0015bfbd;
    }
    uVar9 = (uVar9 & 6) << 2;
    memset((void *)((long)local_58 + (ulong)uVar9),0,(ulong)((uVar9 ^ 0x18) + 8));
  }
LAB_0015bfbd:
  *(ulong *)(uVar2 + 0xf18) = local_58[2];
  *(ulong *)(uVar2 + 0xf20) = local_58[3];
  *(ulong *)(uVar2 + 0xf08) = local_58[0];
  *(ulong *)(uVar2 + 0xf10) = local_58[1];
  pTVar5 = L->top;
LAB_0015bfe4:
  L->top = pTVar5 + 1;
  pTVar5->u64 = (ulong)t | 0xfffa000000000000;
  return 1;
}

Assistant:

LJLIB_CF(jit_prngstate)
{
  GCtab *cur = lj_tab_new(L, 8, 0);

#if LJ_HASJIT
  int i;
  jit_State *J = L2J(L);

  /* The old state. */
  for (i = 1; i <= 4; i++) {
    setintV(lj_tab_setint(L, cur, i*2-1), J->prng.u[i-1] & 0xffffffff);
    setintV(lj_tab_setint(L, cur, i*2), J->prng.u[i-1] >> 32);
  }

  /* We need to set new state using the input array. */
  if (L->base < L->top && !tvisnil(L->base)) {
    PRNGState prng;
    if (tvisnumber(L->base)) {
      TValue *o = L->base;

      if (!tvisint(o) && ((double)(uint32_t)numV(o) != numV(o)))
        lj_err_arg(L, 1, LJ_ERR_PRNGSTATE);

      prng.u[0] = numberVint(o);
      for (i = 1; i < 4; i++)
        prng.u[i] = 0;
    } else {
      GCtab *t = lj_lib_checktab(L, 1);
      int i = 1, len = lj_tab_len(t);

      /* The input array must have at most 8 elements. */
      if (len > 8)
        lj_err_arg(L, 1, LJ_ERR_PRNGSTATE);

      for (i = 1; i <= len; i++) {
        cTValue *v = lj_tab_getint(t, i);

        if (!tvisint(v) && (!tvisnum(v) || (double)(uint32_t)numV(v) != numV(v)))
          lj_err_arg(L, 1, LJ_ERR_PRNGSTATE);

        if (i & 1)
          prng.u[(i-1)/2] = numberVint(v);
        else
          prng.u[(i-1)/2] = prng.u[(i-1)/2] | ((uint64_t)numberVint(v) << 32);
      }
      for (i /= 2; i < 4; i++)
        prng.u[i] = 0;
    }

    /* Re-initialize the JIT prng. */
    J->prng = prng;
  }
#else
  for (int i = 1; i <= 8; i++)
    setintV(lj_tab_setint(L, cur, i), 0);
#endif
  settabV(L, L->top++, cur);
  return 1;
}